

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O2

void helicsCoreMakeConnections(HelicsCore core,char *file,HelicsError *err)

{
  Core *pCVar1;
  allocator<char> local_39;
  string local_38 [32];
  
  pCVar1 = getCore(core,err);
  if (pCVar1 != (Core *)0x0) {
    if (file == (char *)0x0) {
      std::__cxx11::string::string(local_38,&gHelicsEmptyStr_abi_cxx11_);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>(local_38,file,&local_39);
    }
    (*pCVar1->_vptr_Core[0x46])(pCVar1,local_38);
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void helicsCoreMakeConnections(HelicsCore core, const char* file, HelicsError* err)
{
    auto* cppcore = getCore(core, err);
    if (cppcore == nullptr) {
        return;
    }
    try {
        cppcore->makeConnections(AS_STRING(file));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}